

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O2

TypeHandle * __thiscall
IntrusiveList<TypeHandle>::operator[](IntrusiveList<TypeHandle> *this,uint index)

{
  TypeHandle *pTVar1;
  
  while( true ) {
    pTVar1 = this->head;
    if ((index == 0) || (pTVar1 == (TypeHandle *)0x0)) break;
    this = (IntrusiveList<TypeHandle> *)&pTVar1->next;
    index = index - 1;
  }
  if (index == 0) {
    return pTVar1;
  }
  __assert_fail("index == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x3f,
                "T *IntrusiveList<TypeHandle>::operator[](unsigned int) const [T = TypeHandle]");
}

Assistant:

T* operator[](unsigned index) const
	{
		T *curr = head;

		while(index && curr)
		{
			curr = curr->next;
			index--;
		}

		assert(index == 0);

		return curr;
	}